

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_streamable<trng::pareto_dist<float>>(pareto_dist<float> *d)

{
  param_type local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  StringRef local_220;
  AssertionHandler catchAssertionHandler;
  StringRef local_1c8;
  SourceLineInfo local_1b8;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_198 [376];
  
  local_250.gamma_ = 1.0;
  local_250.theta_ = 1.0;
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&local_250);
  local_248 = ZEXT416((uint)local_250.gamma_);
  local_238 = ZEXT416((uint)local_250.theta_);
  local_220.m_start = "REQUIRE";
  local_220.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b8.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c8,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_220,&local_1b8,local_1c8,Normal);
  local_220.m_start =
       (char *)(CONCAT71(local_220.m_start._1_7_,
                         -((d->P).theta_ == (float)local_238._0_4_) &
                         -((d->P).gamma_ == (float)local_248._0_4_)) & 0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}